

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxemu.cpp
# Opt level: O1

bool keys(void)

{
  int iVar1;
  int iVar2;
  char m;
  string local_38;
  
  iVar1 = wgetch(_stdscr);
  if (iVar1 < 0x72) {
    if (iVar1 < 0x20) {
      if (iVar1 != 9) {
        if (iVar1 == 10) {
          iVar1 = 0;
        }
        goto LAB_00108761;
      }
      if (awin == '\0') {
        awin = '\x01';
      }
      else {
        awin = '\0';
      }
    }
    else {
      if (iVar1 == 0x20) {
        iVar1 = 0x62;
        if (running == false) {
          Cpu::lookup_abi_cxx11_(&local_38,&cpu);
          iVar2 = std::__cxx11::string::compare((char *)&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
              &local_38.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_
                                    ));
          }
          if (iVar2 == 0) {
            Cpu::reset(&cpu);
          }
          Cpu::execute(&cpu);
          cursorrow = (int)*pc;
          romr = cursorrow * 0x23;
        }
        goto LAB_00108761;
      }
      if (iVar1 == 0x52) {
        running = false;
        Cpu::reset(&cpu);
      }
      else {
        if (iVar1 != 0x62) goto LAB_00108761;
        breakpoint[cursorrow] = (bool)(breakpoint[cursorrow] ^ 1);
      }
    }
  }
  else if (iVar1 < 0x103) {
    if (iVar1 == 0x72) {
      Cpu::lookup_abi_cxx11_(&local_38,&cpu);
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
          &local_38.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_));
      }
      if (iVar1 == 0) {
        Cpu::reset(&cpu);
      }
      if (running == false) {
        local_38._M_dataplus._M_p._0_1_ = 0x72;
        goto LAB_0010865c;
      }
LAB_0010860e:
      running = false;
    }
    else if (iVar1 == 0x77) {
      Cpu::lookup_abi_cxx11_(&local_38,&cpu);
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
          &local_38.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_));
      }
      if (iVar1 == 0) {
        Cpu::reset(&cpu);
      }
      if (running != false) goto LAB_0010860e;
      local_38._M_dataplus._M_p._0_1_ = 0x77;
LAB_0010865c:
      running = true;
      pthread_create(&walkthread,(pthread_attr_t *)0x0,run,&local_38);
    }
    else {
      if (iVar1 != 0x102) goto LAB_00108761;
      if (awin == '\0') {
        iVar1 = 0x62;
        if ((cursorrow < 0xfff) &&
           (cursorrow = cursorrow + 1, row * 0x23 + romr + -0x46 <= cursorrow * 0x23)) {
          romr = romr + 0x23;
        }
        goto LAB_00108761;
      }
      ramr = ramr + 0x35;
    }
  }
  else if (iVar1 == 0x153) {
    if (awin == '\0') {
      iVar2 = romr + row * -0x23 + 0x46;
      iVar1 = (int)((ulong)((long)iVar2 * -0x15f15f15) >> 0x20) + romr + row * -0x23 + 0x46;
      romr = iVar2;
LAB_0010874c:
      cursorrow = (iVar1 >> 5) - (iVar1 >> 0x1f);
    }
    else {
      ramr = (row / 2) * -0x35 + ramr + 0x6a;
    }
  }
  else if (iVar1 == 0x152) {
    if (awin == '\0') {
      iVar2 = romr + row * 0x23 + -0x46;
      iVar1 = (int)((ulong)((long)iVar2 * -0x15f15f15) >> 0x20) + romr + row * 0x23 + -0x46;
      romr = iVar2;
      goto LAB_0010874c;
    }
    ramr = (row / 2) * 0x35 + ramr + -0x6a;
  }
  else {
    if (iVar1 != 0x103) goto LAB_00108761;
    if (awin == '\0') {
      iVar1 = 0x62;
      if ((0 < cursorrow) && (cursorrow = cursorrow + -1, cursorrow * 0x23 < romr)) {
        romr = romr + -0x23;
      }
      goto LAB_00108761;
    }
    ramr = ramr + -0x35;
  }
  iVar1 = 0x62;
LAB_00108761:
  if (iVar1 != 0) {
    if (romr < 0) {
      romr = 0;
      cursorrow = 0;
    }
    if (ramr < 0) {
      ramr = 0;
    }
    if (0x1002 < (romr / 0x23 - romr / -0x74000000) + row) {
      romr = (0x1002 - row) * 0x23;
    }
    if (0x22 < ramr / 0x35 + row / 2) {
      ramr = (0x22 - row / 2) * 0x35;
    }
  }
  return iVar1 != 0;
}

Assistant:

bool keys()
{
	int ch = getch();
	switch (ch)
	{
			case KEY_UP:
			if (awin == 0)
			{
				if (cursorrow > 0)
				{
					cursorrow--;
					if (cursorrow*35 < romr)romr -= 35;
				}
			}
			else ramr = ramr - 53;
			break;
			case KEY_PPAGE:
			if (awin == 0)
			{
				romr = romr - (row - 2) * 35;
				cursorrow = romr / 35;
			}
			else
				ramr = ramr - (row / 2 - 2) * 53;

			break;
			case KEY_DOWN:
			if (awin == 0)
			{
				if (cursorrow < 4095)
				{
					cursorrow++;
					if (cursorrow*35 >= romr + (row - 2) * 35)romr += 35;
				}
			}
			else
				ramr = ramr + 53;
			break;
			case KEY_NPAGE:
			if (awin == 0)
			{
				romr = romr + (row - 2) * 35;
				cursorrow = romr / 35;
			}
			else ramr = ramr + (row / 2 - 2) * 53;
			break;
			case 10:      // enter
			ch = 0;
			break;
			case 32:      // space
			if (!running)
			{
				if (cpu.lookup() == "END")
				{
					cpu.reset();
				}
				cpu.execute();
				romr = 35 * (*pc);
				cursorrow = romr / 35;
			}
			break;
			case 9:      //tab
			if (awin == 0)awin = 1;
			else awin = 0;
			break;
			case 'r':
			if (cpu.lookup() == "END")
			{
				cpu.reset();
			}
			if (!running)
			{
				running = true;
				char m = 'r';
				pthread_create( &walkthread, NULL, &run, &m);
			}
			else running = false;
			break;
			case 'R':
			running = false;
			cpu.reset();
			break;
			case 'w':
			if (cpu.lookup() == "END")
			{
				cpu.reset();
			}
			if (!running)
			{
				running = true;
				char m = 'w';
				pthread_create( &walkthread, NULL, &run, &m);
			}
			else running = false;
			break;
			case 'b':
				breakpoint[cursorrow] = !breakpoint[cursorrow];
			break;
	}
	if (ch == 0) return false;
	if (romr < 0)
	{
		romr = 0;
		cursorrow = 0;
	}
	if (ramr < 0)ramr = 0;
	if ((romr / 35 + row - 2) > 4096)romr = (4096 - row + 2) * 35;
	if ((ramr / 53 + row / 2 - 2) > 32)ramr = (32 - row / 2 + 2) * 53;
	return true;
}